

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

bool __thiscall mjs::has_octal_escape_sequence(mjs *this,wstring_view s)

{
  uint uVar1;
  const_iterator __begin1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  
  bVar4 = this != (mjs *)0x0;
  if (bVar4) {
    lVar2 = 0;
    bVar3 = false;
    do {
      uVar1 = *(uint *)(s._M_len + lVar2);
      if (bVar3) {
        bVar5 = (uVar1 & 0xfff8) != 0x30;
        if (bVar5) {
          bVar3 = false;
        }
      }
      else {
        if (uVar1 == 0x5c) {
          bVar3 = true;
        }
        bVar5 = true;
      }
      if (!bVar5) {
        return bVar4;
      }
      lVar2 = lVar2 + 4;
      bVar4 = (long)this * 4 != lVar2;
    } while (bVar4);
  }
  return bVar4;
}

Assistant:

bool has_octal_escape_sequence(const std::wstring_view s) {
    bool quote = false;
    for (const auto& ch: s) {
        if (quote) {
            if (is_octal_char(ch)) {
                return true;
            }
            quote = false;
        } else if (ch == '\\') {
            quote = true;
        }
    }
    return false;
}